

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O0

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name>::
set<std::vector<wasm::Name,std::allocator<wasm::Name>>>
          (ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name> *this,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *list)

{
  bool bVar1;
  size_type size_00;
  reference pNVar2;
  undefined1 local_50 [8];
  Name elem;
  const_iterator __end0;
  const_iterator __begin0;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range2;
  size_t i;
  size_t size;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *list_local;
  ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *this_local;
  
  size_00 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size(list);
  if (*(ulong *)(this + 0x10) < size_00) {
    ArenaVector<wasm::Name>::allocate((ArenaVector<wasm::Name> *)this,size_00);
  }
  __range2 = (vector<wasm::Name,_std::allocator<wasm::Name>_> *)0x0;
  __end0 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin(list);
  elem.super_IString.str._M_str =
       (char *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end(list);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                                *)&elem.super_IString.str._M_str);
    if (!bVar1) break;
    pNVar2 = __gnu_cxx::
             __normal_iterator<const_wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
             ::operator*(&__end0);
    local_50 = (undefined1  [8])(pNVar2->super_IString).str._M_len;
    elem.super_IString.str._M_len = (size_t)(pNVar2->super_IString).str._M_str;
    ::wasm::Name::operator=((Name *)(*(long *)this + (long)__range2 * 0x10),(Name *)local_50);
    __gnu_cxx::
    __normal_iterator<const_wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
    operator++(&__end0);
    __range2 = (vector<wasm::Name,_std::allocator<wasm::Name>_> *)
               ((long)&(__range2->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>).
                       _M_impl.super__Vector_impl_data._M_start + 1);
  }
  *(size_type *)(this + 8) = size_00;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }